

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O1

Greetable *
greetable_proxy_new_sync
          (GDBusConnection *connection,GDBusProxyFlags flags,gchar *name,gchar *object_path,
          GCancellable *cancellable,GError **error)

{
  GType GVar1;
  long lVar2;
  Greetable *pGVar3;
  
  GVar1 = greetable_proxy_get_type();
  lVar2 = g_initable_new(GVar1,cancellable,error,"g-flags",flags,"g-name",name,"g-connection",
                         connection,"g-object-path",object_path,"g-interface-name",
                         "io.mangoh.Testing.Greetable",0);
  if (lVar2 != 0) {
    GVar1 = greetable_get_type();
    pGVar3 = (Greetable *)g_type_check_instance_cast(lVar2,GVar1);
    return pGVar3;
  }
  return (Greetable *)0x0;
}

Assistant:

Greetable *
greetable_proxy_new_sync (
    GDBusConnection     *connection,
    GDBusProxyFlags      flags,
    const gchar         *name,
    const gchar         *object_path,
    GCancellable        *cancellable,
    GError             **error)
{
  GInitable *ret;
  ret = g_initable_new (TYPE_GREETABLE_PROXY, cancellable, error, "g-flags", flags, "g-name", name, "g-connection", connection, "g-object-path", object_path, "g-interface-name", "io.mangoh.Testing.Greetable", NULL);
  if (ret != NULL)
    return GREETABLE (ret);
  else
    return NULL;
}